

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O0

uint __thiscall
ON_Object::MoveUserData
          (ON_Object *this,ON_Object *source_object,ON_UUID source_userdata_item_id,
          UserDataConflictResolution userdata_conflict_resolution,bool bDeleteAllSourceItems)

{
  ON_UserData *pOVar1;
  bool bVar2;
  bool bVar3;
  ON_UserData *pOVar4;
  ON_UserData *local_60;
  ON_UserData *source_ud;
  ON_UserData *source_object_userdata_last;
  ON_UserData *source_ud_next;
  ON_UserData *pOStack_40;
  bool bPerformConflictCheck;
  ON_UserData *dest_ud;
  uint local_30;
  bool bIgnoreUserDataItemId;
  uint moved_item_count;
  bool bDeleteAllSourceItems_local;
  UserDataConflictResolution userdata_conflict_resolution_local;
  ON_Object *source_object_local;
  ON_Object *this_local;
  ON_UUID source_userdata_item_id_local;
  
  source_userdata_item_id_local._0_8_ = source_userdata_item_id.Data4;
  this_local = source_userdata_item_id._0_8_;
  local_30 = 0;
  bVar2 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)&this_local);
  if ((this->m_userdata_list == (ON_UserData *)0x0) && (bVar2)) {
    if (source_object->m_userdata_list != (ON_UserData *)0x0) {
      this->m_userdata_list = source_object->m_userdata_list;
      source_object->m_userdata_list = (ON_UserData *)0x0;
      for (pOStack_40 = this->m_userdata_list; pOStack_40 != (ON_UserData *)0x0;
          pOStack_40 = pOStack_40->m_userdata_next) {
        pOStack_40->m_userdata_owner = this;
        local_30 = local_30 + 1;
      }
    }
  }
  else {
    pOVar1 = source_object->m_userdata_list;
    source_object->m_userdata_list = (ON_UserData *)0x0;
    source_ud = (ON_UserData *)0x0;
    while (local_60 = pOVar1, local_60 != (ON_UserData *)0x0) {
      pOVar1 = local_60->m_userdata_next;
      local_60->m_userdata_next = (ON_UserData *)0x0;
      local_60->m_userdata_owner = (ON_Object *)0x0;
      if (((bVar2) ||
          (bVar3 = ::operator==(&local_60->m_userdata_uuid,(ON_UUID_struct *)&this_local), bVar3))
         && (pOVar4 = TransferUserDataItem
                                (this,(ON_UserData *)0x0,local_60,true,userdata_conflict_resolution)
            , pOVar4 != (ON_UserData *)0x0)) {
        local_30 = local_30 + 1;
      }
      else if ((local_60->m_userdata_owner == (ON_Object *)0x0) &&
              (local_60->m_userdata_next == (ON_UserData *)0x0)) {
        if (bDeleteAllSourceItems) {
          if (local_60 != (ON_UserData *)0x0) {
            (*(local_60->super_ON_Object)._vptr_ON_Object[4])();
          }
        }
        else {
          local_60->m_userdata_owner = source_object;
          if (source_object->m_userdata_list == (ON_UserData *)0x0) {
            source_object->m_userdata_list = local_60;
          }
          else if (source_ud != (ON_UserData *)0x0) {
            source_ud->m_userdata_next = local_60;
          }
          source_ud = local_60;
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                   ,0x68a,"","There is a serious bug in this code.");
      }
    }
  }
  return local_30;
}

Assistant:

unsigned int ON_Object::MoveUserData(
  ON_Object& source_object,
  ON_UUID source_userdata_item_id,
  ON_Object::UserDataConflictResolution userdata_conflict_resolution,
  bool bDeleteAllSourceItems)
{
  unsigned int moved_item_count = 0;

  const bool bIgnoreUserDataItemId = (ON_nil_uuid == source_userdata_item_id);

  if ( nullptr == m_userdata_list && bIgnoreUserDataItemId )
  {
    // quick and simple when the "this" doesn't
    // have any user data.
    if ( nullptr != source_object.m_userdata_list )
    {
      m_userdata_list = source_object.m_userdata_list;
      source_object.m_userdata_list = nullptr;
      for (ON_UserData* dest_ud = m_userdata_list; nullptr != dest_ud; dest_ud = dest_ud->m_userdata_next)
      {
        dest_ud->m_userdata_owner = this;
        moved_item_count++;
      }
    }
  }
  else
  {    
    // Carefully move userdata an item at a time from source_object to "this"
    const bool bPerformConflictCheck = true;
    ON_UserData* source_ud_next = source_object.m_userdata_list;
    source_object.m_userdata_list = nullptr;
    ON_UserData* source_object_userdata_last = nullptr;
    for ( ON_UserData* source_ud = source_ud_next; nullptr != source_ud; source_ud = source_ud_next)
    {
      source_ud_next = source_ud->m_userdata_next;
      source_ud->m_userdata_next = nullptr;
      source_ud->m_userdata_owner = nullptr;

      if (bIgnoreUserDataItemId || source_ud->m_userdata_uuid == source_userdata_item_id)
      {
        if (TransferUserDataItem(nullptr, source_ud, bPerformConflictCheck, userdata_conflict_resolution))
        {
          moved_item_count++;
          continue;
        }
      }

      // The transfer did not occur.  Resolve state of orphaned source_ud.
      if (nullptr != source_ud->m_userdata_owner || nullptr != source_ud->m_userdata_next)
      {
        ON_ERROR("There is a serious bug in this code.");
        continue;
      }
      if (bDeleteAllSourceItems)
      {
        // delete the orphan
        delete source_ud;
      }
      else
      {
        // reattach the orphan to source_object
        source_ud->m_userdata_owner = &source_object;
        if (nullptr == source_object.m_userdata_list)
        {
          source_object.m_userdata_list = source_ud;
        }
        else if (nullptr != source_object_userdata_last)
        {
          source_object_userdata_last->m_userdata_next = source_ud;
        }
        source_object_userdata_last = source_ud;
      }
    }
  }

  return moved_item_count;
}